

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000018c600 = 0x2d2d2d2d2d2d2d;
    uRam000000000018c607._0_1_ = '-';
    uRam000000000018c607._1_1_ = '-';
    uRam000000000018c607._2_1_ = '-';
    uRam000000000018c607._3_1_ = '-';
    uRam000000000018c607._4_1_ = '-';
    uRam000000000018c607._5_1_ = '-';
    uRam000000000018c607._6_1_ = '-';
    uRam000000000018c607._7_1_ = '-';
    DAT_0018c5f0 = '-';
    DAT_0018c5f0_1._0_1_ = '-';
    DAT_0018c5f0_1._1_1_ = '-';
    DAT_0018c5f0_1._2_1_ = '-';
    DAT_0018c5f0_1._3_1_ = '-';
    DAT_0018c5f0_1._4_1_ = '-';
    DAT_0018c5f0_1._5_1_ = '-';
    DAT_0018c5f0_1._6_1_ = '-';
    uRam000000000018c5f8 = 0x2d2d2d2d2d2d2d;
    DAT_0018c5ff = 0x2d;
    DAT_0018c5e0 = '-';
    DAT_0018c5e0_1._0_1_ = '-';
    DAT_0018c5e0_1._1_1_ = '-';
    DAT_0018c5e0_1._2_1_ = '-';
    DAT_0018c5e0_1._3_1_ = '-';
    DAT_0018c5e0_1._4_1_ = '-';
    DAT_0018c5e0_1._5_1_ = '-';
    DAT_0018c5e0_1._6_1_ = '-';
    uRam000000000018c5e8._0_1_ = '-';
    uRam000000000018c5e8._1_1_ = '-';
    uRam000000000018c5e8._2_1_ = '-';
    uRam000000000018c5e8._3_1_ = '-';
    uRam000000000018c5e8._4_1_ = '-';
    uRam000000000018c5e8._5_1_ = '-';
    uRam000000000018c5e8._6_1_ = '-';
    uRam000000000018c5e8._7_1_ = '-';
    DAT_0018c5d0 = '-';
    DAT_0018c5d0_1._0_1_ = '-';
    DAT_0018c5d0_1._1_1_ = '-';
    DAT_0018c5d0_1._2_1_ = '-';
    DAT_0018c5d0_1._3_1_ = '-';
    DAT_0018c5d0_1._4_1_ = '-';
    DAT_0018c5d0_1._5_1_ = '-';
    DAT_0018c5d0_1._6_1_ = '-';
    uRam000000000018c5d8._0_1_ = '-';
    uRam000000000018c5d8._1_1_ = '-';
    uRam000000000018c5d8._2_1_ = '-';
    uRam000000000018c5d8._3_1_ = '-';
    uRam000000000018c5d8._4_1_ = '-';
    uRam000000000018c5d8._5_1_ = '-';
    uRam000000000018c5d8._6_1_ = '-';
    uRam000000000018c5d8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000018c5c8._0_1_ = '-';
    uRam000000000018c5c8._1_1_ = '-';
    uRam000000000018c5c8._2_1_ = '-';
    uRam000000000018c5c8._3_1_ = '-';
    uRam000000000018c5c8._4_1_ = '-';
    uRam000000000018c5c8._5_1_ = '-';
    uRam000000000018c5c8._6_1_ = '-';
    uRam000000000018c5c8._7_1_ = '-';
    DAT_0018c60f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }